

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void goodform::json::serialize(any *v,ostream *output)

{
  bool bVar1;
  bool *pbVar2;
  double *pdVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  char *pcVar4;
  
  bVar1 = is<decltype(nullptr)>(v);
  if (bVar1) {
    pcVar4 = "null";
  }
  else {
    bVar1 = is<bool>(v);
    if (!bVar1) {
      bVar1 = is<long>(v);
      if (bVar1) {
        std::any_cast<long_const&>(v);
        std::ostream::_M_insert<long>((long)output);
        return;
      }
      bVar1 = is<unsigned_long>(v);
      if (bVar1) {
        std::any_cast<unsigned_long_const&>(v);
        std::ostream::_M_insert<unsigned_long>((ulong)output);
        return;
      }
      bVar1 = is<double>(v);
      if (bVar1) {
        pdVar3 = std::any_cast<double_const&>(v);
        std::ostream::_M_insert<double>(*pdVar3);
        return;
      }
      bVar1 = is<std::__cxx11::string>(v);
      if (bVar1) {
        input = std::any_cast<std::__cxx11::string_const&>(v);
        write_string(input,output);
        return;
      }
      bVar1 = is<std::vector<std::any,std::allocator<std::any>>>(v);
      if (bVar1) {
        stringify_array(v,output);
        return;
      }
      bVar1 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                        (v);
      if (bVar1) {
        stringify_object(v,output);
        return;
      }
      return;
    }
    pbVar2 = std::any_cast<bool_const&>(v);
    pcVar4 = "false";
    if (*pbVar2 != false) {
      pcVar4 = "true";
    }
  }
  std::operator<<(output,pcVar4);
  return;
}

Assistant:

void json::serialize(const any& v, std::ostream& output)
  {
    if (is<std::nullptr_t>(v))
    {
      output << "null";
    }
    else if (is<bool>(v))
    {
      output << (get<bool>(v) ? "true":"false");
    }
    else if (is<std::int64_t>(v)) output << get<std::int64_t>(v);
    else if (is<std::uint64_t>(v)) output << get<std::uint64_t>(v);
    else if (is<double>(v)) output << get<double>(v);
    else if (is<std::string>(v))
    {
      write_string(get<std::string>(v), output);
    }
    else if (is<goodform::array_t>(v))
    {
      stringify_array(v, output);
    }
    else if (is<goodform::object_t>(v))
    {
      stringify_object(v, output);
    }
  }